

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox_p.h
# Opt level: O2

QSize __thiscall
QComboMenuDelegate::sizeHint
          (QComboMenuDelegate *this,QStyleOptionViewItem *option,QModelIndex *index)

{
  long lVar1;
  QStyle *pQVar2;
  QSize QVar3;
  long in_FS_OFFSET;
  QSize local_c8;
  QStyleOptionMenuItem opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&opt,0xaa,0x98);
  getStyleOption(&opt,this,option,index);
  pQVar2 = QWidget::style(&this->mCombo->super_QWidget);
  local_c8 = QRect::size(&(option->super_QStyleOption).rect);
  QVar3 = (QSize)(**(code **)(*(long *)pQVar2 + 0xe8))(pQVar2,7,&opt,&local_c8,this->mCombo);
  QStyleOptionMenuItem::~QStyleOptionMenuItem(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QSize sizeHint(const QStyleOptionViewItem &option,
                   const QModelIndex &index) const override {
        QStyleOptionMenuItem opt = getStyleOption(option, index);
        return mCombo->style()->sizeFromContents(
            QStyle::CT_MenuItem, &opt, option.rect.size(), mCombo);
    }